

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall Potassco::Application::onUnhandledException(Application *this)

{
  undefined4 in_ESI;
  long in_RDI;
  exception *e;
  
  __cxa_rethrow();
  *(undefined4 *)(in_RDI + 8) = in_ESI;
  return;
}

Assistant:

void Application::onUnhandledException() {
	try { throw; }
	catch (const std::exception& e) { error(e.what()); }
	catch (...)                     { error("Unknown exception"); }
	exit(EXIT_FAILURE);
}